

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlib.cpp
# Opt level: O1

void init_module_testlib(void)

{
  stored_head_type pnVar1;
  long lVar2;
  _func_shared_ptr<Derived> *local_78;
  undefined1 local_70 [80];
  
  boost::python::
  class_<Base,_boost::shared_ptr<Base>,_boost::noncopyable_::noncopyable,_boost::python::detail::not_specified>
  ::class_((class_<Base,_boost::shared_ptr<Base>,_boost::noncopyable_::noncopyable,_boost::python::detail::not_specified>
            *)local_70,"Base","Describes Base");
  boost::python::
  class_<Base,boost::shared_ptr<Base>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
  ::def_maybe_overloads<void(Base::*)(),char[23]>
            ((class_<Base,boost::shared_ptr<Base>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
              *)local_70,"SomeBaseFunc",(first_type)Base::SomeBaseFunc,(char (*) [23])0x0,
             "Describes SomeBaseFunc","Describes SomeBaseFunc");
  if (0 < *(long *)(char *)local_70._0_8_) {
    lVar2 = *(long *)(char *)local_70._0_8_ + -1;
    *(long *)(char *)local_70._0_8_ = lVar2;
    if (lVar2 == 0) {
      _Py_Dealloc();
    }
    boost::python::
    class_<Derived,_boost::python::bases<Base,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>,_boost::shared_ptr<Derived>,_boost::noncopyable_::noncopyable>
    ::class_((class_<Derived,_boost::python::bases<Base,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>,_boost::shared_ptr<Derived>,_boost::noncopyable_::noncopyable>
              *)local_70,"Derived","Describes Derived");
    boost::python::
    class_<Derived,boost::python::bases<Base,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::shared_ptr<Derived>,boost::noncopyable_::noncopyable>
    ::def_maybe_overloads<void(Derived::*)(),char[26]>
              ((class_<Derived,boost::python::bases<Base,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::shared_ptr<Derived>,boost::noncopyable_::noncopyable>
                *)local_70,"SomeDerivedFunc",(first_type)Derived::SomeDerivedFunc,(char (*) [26])0x0
               ,"Describes SomeDerivedFunc","Describes SomeDerivedFunc");
    if (0 < *(long *)(char *)local_70._0_8_) {
      lVar2 = *(long *)(char *)local_70._0_8_ + -1;
      *(long *)(char *)local_70._0_8_ = lVar2;
      if (lVar2 == 0) {
        _Py_Dealloc();
      }
      boost::python::
      class_<Derived2,_boost::python::bases<Derived,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>,_boost::shared_ptr<Derived2>,_boost::noncopyable_::noncopyable>
      ::class_((class_<Derived2,_boost::python::bases<Derived,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>,_boost::shared_ptr<Derived2>,_boost::noncopyable_::noncopyable>
                *)local_70,"Derived2","Describes Derived2");
      boost::python::
      class_<Derived2,boost::python::bases<Derived,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::shared_ptr<Derived2>,boost::noncopyable_::noncopyable>
      ::def_maybe_overloads<void(Base::*)(),char[23]>
                ((class_<Derived2,boost::python::bases<Derived,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::shared_ptr<Derived2>,boost::noncopyable_::noncopyable>
                  *)local_70,"SomeBaseFunc",(first_type)Base::SomeBaseFunc,(char (*) [23])0x0,
                 "Describes SomeBaseFunc","Describes SomeBaseFunc");
      boost::python::
      class_<Derived2,boost::python::bases<Derived,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::shared_ptr<Derived2>,boost::noncopyable_::noncopyable>
      ::def_maybe_overloads<void(Derived::*)(),char[26]>
                ((class_<Derived2,boost::python::bases<Derived,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::shared_ptr<Derived2>,boost::noncopyable_::noncopyable>
                  *)local_70,"SomeDerivedFunc",(first_type)Derived::SomeDerivedFunc,
                 (char (*) [26])0x0,"Describes SomeDerivedFunc","Describes SomeDerivedFunc");
      boost::python::
      class_<Derived2,boost::python::bases<Derived,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::shared_ptr<Derived2>,boost::noncopyable_::noncopyable>
      ::def_maybe_overloads<void(Derived2::*)(),char[27]>
                ((class_<Derived2,boost::python::bases<Derived,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::shared_ptr<Derived2>,boost::noncopyable_::noncopyable>
                  *)local_70,"SomeDerived2Func",(first_type)Derived2::SomeDerived2Func,
                 (char (*) [27])0x0,"Describes SomeDerived2Func","Describes SomeDerived2Func");
      if (0 < *(long *)(char *)local_70._0_8_) {
        lVar2 = *(long *)(char *)local_70._0_8_ + -1;
        *(long *)(char *)local_70._0_8_ = lVar2;
        if (lVar2 == 0) {
          _Py_Dealloc();
        }
        local_78 = CreateDerived;
        pnVar1 = (stored_head_type)(local_70 + 0x48);
        local_70._0_8_ = "Describes CreateDerived";
        local_70._48_8_ = (stored_head_type)0x0;
        local_70._56_8_ = 0;
        local_70._64_8_ = 0;
        local_70._8_8_ = pnVar1;
        local_70._16_8_ = pnVar1;
        local_70._24_8_ = pnVar1;
        boost::python::detail::
        def_from_helper<boost::shared_ptr<Derived>(*)(),boost::python::detail::def_helper<char[24],boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>>
                  ("CreateDerived",&local_78,
                   (def_helper<char[24],_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
                    *)local_70);
        local_78 = CreateDerived2;
        local_70._0_8_ = "Describes CreateDerived2";
        local_70._48_8_ = (stored_head_type)0x0;
        local_70._56_8_ = 0;
        local_70._64_8_ = 0;
        local_70._8_8_ = pnVar1;
        local_70._16_8_ = pnVar1;
        local_70._24_8_ = pnVar1;
        boost::python::detail::
        def_from_helper<boost::shared_ptr<Derived>(*)(),boost::python::detail::def_helper<char[25],boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>>
                  ("CreateDerived2",&local_78,
                   (def_helper<char[25],_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
                    *)local_70);
        return;
      }
    }
  }
  __assert_fail("Py_REFCNT(m_ptr) > 0","/usr/include/boost/python/object_core.hpp",0x1a6,
                "boost::python::api::object_base::~object_base()");
}

Assistant:

BOOST_PYTHON_MODULE(testlib)
{
    bp::class_<Base, boost::shared_ptr<Base>, boost::noncopyable>("Base", "Describes Base")
        .def("SomeBaseFunc", &Base::SomeBaseFunc, "Describes SomeBaseFunc");

    bp::class_<Derived, bp::bases<Base>, boost::shared_ptr<Derived>, boost::noncopyable>("Derived", "Describes Derived")
        .def("SomeDerivedFunc", &Derived::SomeDerivedFunc, "Describes SomeDerivedFunc");

    bp::class_<Derived2, bp::bases<Derived>, boost::shared_ptr<Derived2>, boost::noncopyable>("Derived2", "Describes Derived2")
        .def("SomeBaseFunc", &Base::SomeBaseFunc, "Describes SomeBaseFunc")
        .def("SomeDerivedFunc", &Derived::SomeDerivedFunc, "Describes SomeDerivedFunc")
        .def("SomeDerived2Func", &Derived2::SomeDerived2Func, "Describes SomeDerived2Func");

    bp::def("CreateDerived", CreateDerived, "Describes CreateDerived");
    bp::def("CreateDerived2", CreateDerived2, "Describes CreateDerived2");
}